

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b-plus-tree.cpp
# Opt level: O0

Node * __thiscall BPTree::search(BPTree *this,float x,bool flag,bool printer)

{
  float fVar1;
  code *pcVar2;
  ostream *poVar3;
  size_type sVar4;
  int local_40;
  int local_3c;
  int j_3;
  int i_1;
  int j_2;
  int j_1;
  int j;
  int i;
  Node *cursor;
  bool printer_local;
  bool flag_local;
  float x_local;
  BPTree *this_local;
  
  if (this->root == (Node *)0x0) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  _j = this->root;
LAB_0011a59f:
  do {
    if ((_j->IS_LEAF & 1U) != 0) {
      if (printer) {
        for (j_3 = 0; j_3 < _j->size; j_3 = j_3 + 1) {
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_j->key[j_3].key_value)
          ;
          std::operator<<(poVar3," ");
        }
        std::operator<<((ostream *)&std::cout,"\n");
      }
      local_3c = 0;
      while( true ) {
        if (_j->size <= local_3c) {
          return (Node *)0x0;
        }
        fVar1 = _j->key[local_3c].key_value;
        if ((fVar1 == x) && (!NAN(fVar1) && !NAN(x))) break;
        local_3c = local_3c + 1;
      }
      if (flag) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Size: ");
        sVar4 = std::vector<void_*,_std::allocator<void_*>_>::size(&_j->key[local_3c].add_vect);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
        std::operator<<(poVar3,"\n");
        sVar4 = std::vector<void_*,_std::allocator<void_*>_>::size(&_j->key[local_3c].add_vect);
        printf("Number of Data Blocks: %d",sVar4);
        printf("\n");
        for (local_40 = 0;
            sVar4 = std::vector<void_*,_std::allocator<void_*>_>::size(&_j->key[local_3c].add_vect),
            (ulong)(long)local_40 < sVar4; local_40 = local_40 + 1) {
        }
      }
      return _j;
    }
    j_1 = 0;
LAB_0011a5ba:
    if (_j->size <= j_1) goto LAB_0011a59f;
    if (_j->key[j_1].key_value <= x) {
      if (j_1 != _j->size + -1) {
        j_1 = j_1 + 1;
        goto LAB_0011a5ba;
      }
      if (printer) {
        for (i_1 = 0; i_1 < _j->size; i_1 = i_1 + 1) {
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_j->key[i_1].key_value)
          ;
          std::operator<<(poVar3," ");
        }
        std::operator<<((ostream *)&std::cout,"\n");
      }
      _j = _j->ptr[j_1 + 1];
      goto LAB_0011a59f;
    }
    if (printer) {
      for (j_2 = 0; j_2 < _j->size; j_2 = j_2 + 1) {
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,_j->key[j_2].key_value);
        std::operator<<(poVar3," ");
      }
      std::operator<<((ostream *)&std::cout,"\n");
    }
    _j = _j->ptr[j_1];
  } while( true );
}

Assistant:

Node* search(float x, bool flag, bool printer)
    {
        //search logic
        if(root==NULL)
        {
            //empty
            //cout<<"Tree empty\n";
        }
        else
        {
            Node* cursor = root;
            //in the following while loop, cursor will travel to the leaf node possibly consisting the key
            while(cursor->IS_LEAF == false)
            {
                for(int i = 0; i < cursor->size; i++)
                {
                    if(x < cursor->key[i].key_value)
                    {
                        if (printer == true) {
                            for (int j = 0; j < cursor->size; j++) {
                                cout << cursor->key[j].key_value << " ";
                            }
                            cout << "\n";
                        }
                        cursor = cursor->ptr[i];
                        break;
                    }
                    if(i == cursor->size - 1)
                    {
                        if (printer == true) {
                            for (int j = 0; j < cursor->size; j++) {
                                cout << cursor->key[j].key_value << " ";
                            }
                            cout << "\n";
                        }
                        cursor = cursor->ptr[i+1];
                        break;
                    }
                }
            }
            //in the following for loop, we search for the key if it exists
            if (printer == true) {
                for (int j = 0; j < cursor->size; j++) {
                    cout << cursor->key[j].key_value << " ";
                }
                cout << "\n";
            }
            for(int i = 0; i < cursor->size; i++)
            {
                if(cursor->key[i].key_value == x)
                {
                    //cout<<"Found\n";
                    if (flag == true) {
                        cout <<"Size: "<< cursor->key[i].add_vect.size() << "\n";
                        printf("Number of Data Blocks: %d", cursor->key[i].add_vect.size());
                        printf("\n");
                        for (int j = 0; j < cursor->key[i].add_vect.size(); ++j) {
                            //printf("Data Block: ");
                            //printf("%p", (uchar *) cursor->key[i].add_vect[j]);
                            //printf("\n");
                            //printf("tconst: ");
                            //cout << (*(Record *) cursor->key[i].add_vect[j]).tconst << "\n";
                        }
                    }
                    return cursor;
                }
            }
            //cout<<"Not found\n";
            return nullptr;
        }
    }